

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaEquiv.c
# Opt level: O0

Gia_Man_t * Gia_ManEquivRemapDfs(Gia_Man_t *p)

{
  int iVar1;
  int iVar2;
  Gia_Man_t *p_00;
  Gia_Rpr_t *pGVar3;
  Gia_Obj_t *pGVar4;
  Vec_Int_t *p_01;
  int *piVar5;
  int local_34;
  int iPrev;
  int iRepr;
  int iNode;
  int k;
  int i;
  Vec_Int_t *vClass;
  Gia_Man_t *pNew;
  Gia_Man_t *p_local;
  
  p_00 = Gia_ManDupDfs(p);
  iVar1 = Gia_ManObjNum(p_00);
  pGVar3 = (Gia_Rpr_t *)calloc((long)iVar1,4);
  p_00->pReprs = pGVar3;
  for (iNode = 0; iVar1 = Gia_ManObjNum(p_00), iNode < iVar1; iNode = iNode + 1) {
    Gia_ObjSetRepr(p_00,iNode,0xfffffff);
  }
  for (iNode = 1; iVar1 = Gia_ManObjNum(p), iNode < iVar1; iNode = iNode + 1) {
    iVar1 = Gia_ObjIsConst(p,iNode);
    if (iVar1 != 0) {
      pGVar4 = Gia_ManObj(p,iNode);
      iVar1 = Abc_Lit2Var(pGVar4->Value);
      Gia_ObjSetRepr(p_00,iVar1,0);
    }
  }
  p_01 = Vec_IntAlloc(100);
  iNode = 1;
  do {
    iVar1 = Gia_ManObjNum(p);
    if (iVar1 <= iNode) {
      Vec_IntFree(p_01);
      piVar5 = Gia_ManDeriveNexts(p_00);
      p_00->pNexts = piVar5;
      return p_00;
    }
    iVar1 = Gia_ObjIsHead(p,iNode);
    if (iVar1 != 0) {
      Vec_IntClear(p_01);
      iVar1 = Gia_ObjIsHead(p,iNode);
      if (iVar1 == 0) {
        __assert_fail("Gia_ObjIsHead(p, i)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaEquiv.c"
                      ,0x3b7,"Gia_Man_t *Gia_ManEquivRemapDfs(Gia_Man_t *)");
      }
      for (iRepr = iNode; 0 < iRepr; iRepr = Gia_ObjNext(p,iRepr)) {
        pGVar4 = Gia_ManObj(p,iRepr);
        iVar1 = Abc_Lit2Var(pGVar4->Value);
        Vec_IntPushUnique(p_01,iVar1);
      }
      iVar1 = Vec_IntSize(p_01);
      if (iVar1 < 2) {
        __assert_fail("Vec_IntSize( vClass ) > 1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaEquiv.c"
                      ,0x3b9,"Gia_Man_t *Gia_ManEquivRemapDfs(Gia_Man_t *)");
      }
      Vec_IntSort(p_01,0);
      iVar1 = Vec_IntEntry(p_01,0);
      local_34 = iVar1;
      for (iRepr = 1; iVar2 = Vec_IntSize(p_01), iRepr < iVar2; iRepr = iRepr + 1) {
        iVar2 = Vec_IntEntry(p_01,iRepr);
        Gia_ObjSetRepr(p_00,iVar2,iVar1);
        if (iVar2 <= local_34) {
          __assert_fail("iPrev < iNode",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaEquiv.c"
                        ,0x3bf,"Gia_Man_t *Gia_ManEquivRemapDfs(Gia_Man_t *)");
        }
        local_34 = iVar2;
      }
    }
    iNode = iNode + 1;
  } while( true );
}

Assistant:

Gia_Man_t * Gia_ManEquivRemapDfs( Gia_Man_t * p )
{
    Gia_Man_t * pNew;
    Vec_Int_t * vClass;
    int i, k, iNode, iRepr, iPrev;
    pNew = Gia_ManDupDfs( p );
    // start representatives
    pNew->pReprs = ABC_CALLOC( Gia_Rpr_t, Gia_ManObjNum(pNew) );
    for ( i = 0; i < Gia_ManObjNum(pNew); i++ )
        Gia_ObjSetRepr( pNew, i, GIA_VOID );
    // iterate over constant candidates
    Gia_ManForEachConst( p, i )
        Gia_ObjSetRepr( pNew, Abc_Lit2Var(Gia_ManObj(p, i)->Value), 0 );
    // iterate over class candidates
    vClass = Vec_IntAlloc( 100 );
    Gia_ManForEachClass( p, i )
    {
        Vec_IntClear( vClass );
        Gia_ClassForEachObj( p, i, k )
            Vec_IntPushUnique( vClass, Abc_Lit2Var(Gia_ManObj(p, k)->Value) );
        assert( Vec_IntSize( vClass ) > 1 );
        Vec_IntSort( vClass, 0 );
        iRepr = iPrev = Vec_IntEntry( vClass, 0 );
        Vec_IntForEachEntryStart( vClass, iNode, k, 1 )
        {
            Gia_ObjSetRepr( pNew, iNode, iRepr );
            assert( iPrev < iNode );
            iPrev = iNode;
        }
    }
    Vec_IntFree( vClass );
    pNew->pNexts = Gia_ManDeriveNexts( pNew );
    return pNew;
}